

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O2

void __thiscall Disa::Matrix_Sparse::resize(Matrix_Sparse *this,size_t *row,size_t *column)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  const_iterator __last;
  pointer pdVar1;
  pointer puVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  pointer puVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  unsigned_long local_50;
  vector<double,_std::allocator<double>_> *local_48;
  Matrix_Sparse *local_40;
  long local_38;
  
  puVar2 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar5 = *row;
  if (((long)puVar3 - (long)puVar2 != 0) && (uVar5 < ((long)puVar3 - (long)puVar2 >> 3) - 1U)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->column_index,puVar2[uVar5]);
    std::vector<double,_std::allocator<double>_>::resize
              (&this->element_value,
               (this->row_non_zero).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[*row]);
    uVar5 = *row;
    puVar2 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  if (puVar2 == puVar3) {
    local_50 = 0;
  }
  else {
    local_50 = puVar3[-1];
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->row_non_zero,uVar5 + 1,&local_50);
  uVar5 = *column;
  if (uVar5 < this->column_size) {
    this_00 = &this->column_index;
    local_48 = &this->element_value;
    puVar2 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar7 = 0;
    local_40 = this;
    for (uVar5 = 0;
        (lVar4 = (long)(this->row_non_zero).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar2, lVar4 != 0 &&
        (uVar5 < (lVar4 >> 3) - 1U)); uVar5 = uVar5 + 1) {
      puVar3 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __last._M_current = puVar3 + (puVar2[uVar5 + 1] - lVar7);
      local_50 = *column - 1;
      __first = std::
                __upper_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,__gnu_cxx::__ops::_Val_less_iter>
                          (puVar3 + puVar2[uVar5],__last._M_current,&local_50);
      if (__first._M_current != __last._M_current) {
        puVar2 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        lVar6 = (long)__first._M_current - (long)puVar2;
        lVar4 = (long)__last._M_current - (long)puVar2;
        local_38 = lVar7;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                  (this_00,(const_iterator)__first._M_current,__last);
        lVar7 = local_38;
        pdVar1 = (local_48->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<double,_std::allocator<double>_>::erase
                  (local_48,(double *)(lVar6 + (long)pdVar1),(double *)(lVar4 + (long)pdVar1));
        lVar7 = (lVar7 - (lVar6 >> 3)) + (lVar4 >> 3);
        this = local_40;
      }
      puVar2 = (this->row_non_zero).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar2[uVar5 + 1] = puVar2[uVar5 + 1] - lVar7;
    }
    uVar5 = *column;
  }
  this->column_size = uVar5;
  return;
}

Assistant:

void Matrix_Sparse::resize(const std::size_t& row, const std::size_t& column) {

  // resize rows first
  if(row < size_row()) {
    column_index.resize(row_non_zero[row]);
    element_value.resize(row_non_zero[row]);
  }
  row_non_zero.resize(row + 1, row_non_zero.empty() ? 0 : row_non_zero.back());

  // resize columns
  // Note: Since we may have to do column erases over multiple rows we do it directly here rather than use erase().
  if(column < size_column()) {
    std::size_t offset_loss = 0;
    FOR(i_row, size_row()) {
      const auto& iter_column_end = column_index.begin() + static_cast<s_size_t>(row_non_zero[i_row + 1] - offset_loss);
      auto iter_column =
      std::upper_bound(column_index.begin() + static_cast<s_size_t>(row_non_zero[i_row]), iter_column_end, column - 1);
      if(iter_column != iter_column_end) {
        const s_size_t& start_distance = std::distance(column_index.begin(), iter_column);
        const s_size_t& end_distance = std::distance(column_index.begin(), iter_column_end);
        column_index.erase(iter_column, iter_column_end);
        element_value.erase(element_value.begin() + start_distance, element_value.begin() + end_distance);
        offset_loss += end_distance - start_distance;
      }
      row_non_zero[i_row + 1] -= offset_loss;
    }
  }
  column_size = column;
}